

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *c,ItemNamer *vnam)

{
  double value;
  char *pcVar1;
  Buffer<char> *pBVar2;
  size_t __n;
  size_t sVar3;
  ulong uVar4;
  char *str;
  ptrdiff_t _Num;
  FormatSpec local_48;
  
  pcVar1 = (c->super_BasicConstraint).name_._M_dataplus._M_p;
  __n = strlen(pcVar1);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar2->size_ + __n;
  if (pBVar2->capacity_ < uVar4) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar2->ptr_ + pBVar2->size_,pcVar1,__n);
  }
  pBVar2->size_ = uVar4;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar2->size_;
  uVar4 = sVar3 + 2;
  if (pBVar2->capacity_ < uVar4) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar4);
    sVar3 = pBVar2->size_;
  }
  pcVar1 = pBVar2->ptr_;
  (pcVar1 + sVar3)[0] = ':';
  (pcVar1 + sVar3)[1] = ' ';
  pBVar2->size_ = uVar4;
  value = (c->super_AlgConRhs<0>).rhs_;
  WriteModelItem(wrt,&c->super_LinTerms,vnam);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar2->size_;
  if (sVar3 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar3 + 1);
    sVar3 = pBVar2->size_;
  }
  pBVar2->size_ = sVar3 + 1;
  pBVar2->ptr_[sVar3] = ' ';
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar2->size_;
  uVar4 = sVar3 + 2;
  if (pBVar2->capacity_ < uVar4) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar4);
    sVar3 = pBVar2->size_;
  }
  pcVar1 = pBVar2->ptr_;
  (pcVar1 + sVar3)[0] = '=';
  (pcVar1 + sVar3)[1] = '=';
  pBVar2->size_ = uVar4;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar2->size_;
  if (sVar3 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar3 + 1);
    sVar3 = pBVar2->size_;
  }
  pBVar2->size_ = sVar3 + 1;
  pBVar2->ptr_[sVar3] = ' ';
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value,&local_48);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}